

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

int __thiscall QXmlStreamReaderPrivate::init(QXmlStreamReaderPrivate *this,EVP_PKEY_CTX *ctx)

{
  ArrayOptions *pAVar1;
  QString *this_00;
  int *piVar2;
  long lVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  uint *puVar6;
  Attribute *pAVar7;
  long lVar8;
  qsizetype alloc;
  long in_FS_OFFSET;
  State SStack_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->scanDtd = false;
  this->lastAttributeIsCData = false;
  this->token = -1;
  this->token_char = 0;
  *(ushort *)&this->field_0x3a8 = (ushort)*(undefined4 *)&this->field_0x3a8 & 0xdff0 | 2;
  this->resumeReduction = 0;
  this->tos = 1;
  piVar2 = this->state_stack;
  *piVar2 = 0;
  piVar2[this->tos] = 0;
  (this->putStack).tos = -1;
  lVar3 = (this->putStack).cap;
  if (lVar3 < 0x20) {
    lVar3 = lVar3 * 2;
    lVar8 = 0x20;
    if (0x20 < lVar3) {
      lVar8 = lVar3;
    }
    (this->putStack).cap = lVar8;
    puVar6 = (uint *)realloc((this->putStack).data,lVar8 << 2);
    (this->putStack).data = puVar6;
    if (puVar6 != (uint *)0x0) goto LAB_0039f6cf;
LAB_0039f937:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      qBadAlloc();
    }
  }
  else {
LAB_0039f6cf:
    this_00 = &this->textBuffer;
    if ((this->textBuffer).d.ptr != (char16_t *)0x0) {
      pQVar4 = &((this_00->d).d)->super_QArrayData;
      (this_00->d).d = (Data *)0x0;
      (this->textBuffer).d.ptr = (char16_t *)0x0;
      (this->textBuffer).d.size = 0;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    pDVar5 = (this_00->d).d;
    if (((pDVar5 == (Data *)0x0) ||
        (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar5->super_QArrayData).alloc -
        ((long)((long)(this->textBuffer).d.ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <
        0x101)) {
      lVar3 = (this->textBuffer).d.size;
      alloc = 0x100;
      if (0x100 < lVar3) {
        alloc = lVar3;
      }
      QString::reallocData(this_00,alloc,KeepSize);
    }
    pDVar5 = (this_00->d).d;
    if ((pDVar5 != (Data *)0x0) && ((pDVar5->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar5->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    (this->super_QXmlStreamPrivateTagStack).tagStack.tos = -1;
    (this->super_QXmlStreamPrivateTagStack).tagsDone = false;
    QList<QXmlStreamAttribute>::clear(&(this->attributes).super_QList<QXmlStreamAttribute>);
    QList<QXmlStreamAttribute>::reserve(&(this->attributes).super_QList<QXmlStreamAttribute>,0x10);
    this->readBufferPos = 0;
    this->nbytesread = 0;
    this->lineNumber = 0;
    this->lastLineStart = 0;
    this->characterOffset = 0;
    SStack_60.clearFn = (ClearDataFn)0x0;
    SStack_60.field_4.d[0] = (void *)0x0;
    SStack_60.field_4.d[1] = (void *)0x0;
    SStack_60.remainingChars = 0;
    SStack_60.invalidChars = 0;
    SStack_60.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
    SStack_60.internalState = 0;
    (this->decoder).super_QStringConverter.iface = (Interface *)0x0;
    QStringConverterBase::State::clear(&(this->decoder).super_QStringConverter.state);
    (this->decoder).super_QStringConverter.state.flags.
    super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (Int)SStack_60.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
              super_QFlagsStorage<QStringConverterBase::Flag>.i;
    (this->decoder).super_QStringConverter.state.remainingChars = SStack_60.remainingChars;
    (this->decoder).super_QStringConverter.state.invalidChars = SStack_60.invalidChars;
    (this->decoder).super_QStringConverter.state.field_4.d[0] = SStack_60.field_4.d[0];
    (this->decoder).super_QStringConverter.state.field_4.d[1] = SStack_60.field_4.d[1];
    (this->decoder).super_QStringConverter.state.clearFn = SStack_60.clearFn;
    SStack_60.clearFn = (ClearDataFn)0x0;
    QStringConverterBase::State::clear(&SStack_60);
    (this->attributeStack).tos = -1;
    lVar3 = (this->attributeStack).cap;
    if (lVar3 < 0x10) {
      lVar3 = lVar3 * 2;
      lVar8 = 0x10;
      if (0x10 < lVar3) {
        lVar8 = lVar3;
      }
      (this->attributeStack).cap = lVar8;
      pAVar7 = (Attribute *)realloc((this->attributeStack).data,lVar8 * 0x30);
      (this->attributeStack).data = pAVar7;
      if (pAVar7 == (Attribute *)0x0) goto LAB_0039f937;
    }
    std::__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
    reset((__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *
          )&this->entityParser,(pointer)0x0);
    this->atEnd = false;
    *(ushort *)&this->field_0x3a8 = (ushort)*(undefined4 *)&this->field_0x3a8 & 0xe00f | 0x1000;
    QByteArray::clear(&this->rawReadBuffer);
    QByteArray::clear(&this->dataBuffer);
    if ((this->readBuffer).d.ptr != (char16_t *)0x0) {
      pQVar4 = &((this->readBuffer).d.d)->super_QArrayData;
      (this->readBuffer).d.d = (Data *)0x0;
      (this->readBuffer).d.ptr = (char16_t *)0x0;
      (this->readBuffer).d.size = 0;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    (this->super_QXmlStreamPrivateTagStack).tagStackStringStorageSize =
         (this->super_QXmlStreamPrivateTagStack).initialTagStackStringStorageSize;
    this->type = NoToken;
    this->error = NoError;
    this->currentContext = Prolog;
    this->foundDTD = false;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::init()
{
    scanDtd = false;
    lastAttributeIsCData = false;
    token = -1;
    token_char = 0;
    isEmptyElement = false;
    isWhitespace = true;
    isCDATA = false;
    standalone = false;
    hasStandalone = false;
    tos = 0;
    resumeReduction = 0;
    state_stack[tos++] = 0;
    state_stack[tos] = 0;
    putStack.clear();
    putStack.reserve(32);
    textBuffer.clear();
    textBuffer.reserve(256);
    tagStack.clear();
    tagsDone = false;
    attributes.clear();
    attributes.reserve(16);
    lineNumber = lastLineStart = characterOffset = 0;
    readBufferPos = 0;
    nbytesread = 0;
    decoder = QStringDecoder();
    attributeStack.clear();
    attributeStack.reserve(16);
    entityParser.reset();
    hasCheckedStartDocument = false;
    normalizeLiterals = false;
    hasSeenTag = false;
    atEnd = false;
    inParseEntity = false;
    referenceToUnparsedEntityDetected = false;
    referenceToParameterEntityDetected = false;
    hasExternalDtdSubset = false;
    lockEncoding = false;
    namespaceProcessing = true;
    rawReadBuffer.clear();
    dataBuffer.clear();
    readBuffer.clear();
    tagStackStringStorageSize = initialTagStackStringStorageSize;

    type = QXmlStreamReader::NoToken;
    error = QXmlStreamReader::NoError;
    currentContext = XmlContext::Prolog;
    foundDTD = false;
}